

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_get_tile_descriptor
          (exr_const_context_t ctxt,int part_index,uint32_t *xsize,uint32_t *ysize,
          exr_tile_level_mode_t *level,exr_tile_round_mode_t *round)

{
  long lVar1;
  uint32_t *puVar2;
  exr_result_t eVar3;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       *(code **)(ctxt + 0x48));
    return eVar3;
  }
  lVar1 = *(long *)(*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 0x60);
  if (lVar1 == 0) {
    return 0xf;
  }
  if (*(int *)(lVar1 + 0x14) == 0x15) {
    puVar2 = *(uint32_t **)(lVar1 + 0x18);
    if (xsize != (uint32_t *)0x0) {
      *xsize = *puVar2;
    }
    if (ysize != (uint32_t *)0x0) {
      *ysize = puVar2[1];
    }
    if (level != (exr_tile_level_mode_t *)0x0) {
      *level = (byte)puVar2[2] & 0xf;
    }
    if (round != (exr_tile_round_mode_t *)0x0) {
      *round = (uint)(byte)((byte)puVar2[2] >> 4);
    }
    return 0;
  }
  eVar3 = (**(code **)(ctxt + 0x48))
                    (ctxt,6,"Invalid required attribute type \'%s\' for \'tiles\'",
                     *(undefined8 *)(lVar1 + 8),*(code **)(ctxt + 0x48));
  return eVar3;
}

Assistant:

exr_result_t
exr_get_tile_descriptor (
    exr_const_context_t    ctxt,
    int                    part_index,
    uint32_t*              xsize,
    uint32_t*              ysize,
    exr_tile_level_mode_t* level,
    exr_tile_round_mode_t* round)
{
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (part->tiles)
    {
        const exr_attr_tiledesc_t* out = part->tiles->tiledesc;

        if (part->tiles->type != EXR_ATTR_TILEDESC)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid required attribute type '%s' for 'tiles'",
                part->tiles->type_name));

        if (xsize) *xsize = out->x_size;
        if (ysize) *ysize = out->y_size;
        if (level) *level = EXR_GET_TILE_LEVEL_MODE (*out);
        if (round) *round = EXR_GET_TILE_ROUND_MODE (*out);
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_NO_ATTR_BY_NAME);
}